

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O1

RayDifferential * __thiscall
pbrt::Transform::operator()
          (RayDifferential *__return_storage_ptr__,Transform *this,RayDifferential *r,Float *tMax)

{
  Float FVar1;
  Float FVar2;
  float fVar3;
  Float FVar4;
  float fVar5;
  Float FVar6;
  float fVar7;
  Float FVar8;
  float fVar9;
  Float FVar10;
  undefined8 uVar11;
  uintptr_t uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  Interval<float> i;
  Interval<float> i_00;
  Interval<float> i_01;
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  float fVar31;
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  Point3fi o;
  Point3fi local_b8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  Interval<float> local_38;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  local_78._0_4_ = (r->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
  local_98._0_4_ = (r->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
  local_88._0_4_ = (r->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
  fVar31 = (r->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
  auVar19._4_4_ = fVar31;
  auVar19._0_4_ = fVar31;
  auVar19._8_4_ = fVar31;
  auVar19._12_4_ = fVar31;
  FVar1 = (r->super_Ray).time;
  uVar12 = (r->super_Ray).medium.
           super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           .bits;
  fVar31 = (r->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
  auVar18._4_4_ = fVar31;
  auVar18._0_4_ = fVar31;
  auVar18._8_4_ = fVar31;
  auVar18._12_4_ = fVar31;
  local_48 = vmovlhps_avx(auVar19,auVar18);
  fVar31 = (r->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
  auVar20._4_4_ = fVar31;
  auVar20._0_4_ = fVar31;
  auVar20._8_4_ = fVar31;
  auVar20._12_4_ = fVar31;
  local_38 = (Interval<float>)vmovlps_avx(auVar20);
  operator()(&local_b8,this,(Point3fi *)local_48);
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)((float)local_98._0_4_ * (this->m).m[0][1])),
                            ZEXT416((uint)local_78._0_4_),ZEXT416((uint)(this->m).m[0][0]));
  auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)local_88._0_4_),ZEXT416((uint)(this->m).m[0][2]));
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)((float)local_98._0_4_ * (this->m).m[1][1])),
                            ZEXT416((uint)local_78._0_4_),ZEXT416((uint)(this->m).m[1][0]));
  auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)local_88._0_4_),ZEXT416((uint)(this->m).m[1][2]));
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)((float)local_98._0_4_ * (this->m).m[2][1])),
                            ZEXT416((uint)local_78._0_4_),ZEXT416((uint)(this->m).m[2][0]));
  local_78 = vfmadd231ss_fma(auVar20,ZEXT416((uint)local_88._0_4_),ZEXT416((uint)(this->m).m[2][2]))
  ;
  fVar33 = local_78._0_4_;
  fVar34 = auVar18._0_4_;
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * fVar34)),auVar19,auVar19);
  auVar20 = vfmadd231ss_fma(auVar20,local_78,local_78);
  auVar21._0_12_ = ZEXT812(0);
  auVar21._12_4_ = 0;
  fVar31 = auVar20._0_4_;
  bVar16 = NAN(fVar31);
  bVar17 = fVar31 == 0.0;
  local_88 = auVar19;
  local_98 = auVar18;
  if (0.0 < fVar31) {
    auVar22._8_4_ = 0x7fffffff;
    auVar22._0_8_ = 0x7fffffff7fffffff;
    auVar22._12_4_ = 0x7fffffff;
    auVar20 = vandps_avx(auVar19,auVar22);
    auVar18 = vandps_avx(auVar18,auVar22);
    auVar22 = vandps_avx(local_78,auVar22);
    auVar18 = vfmadd231ss_fma(ZEXT416((uint)(auVar18._0_4_ * 0.0)),auVar21,auVar20);
    auVar18 = vfmadd231ss_fma(auVar18,auVar21,auVar22);
    fVar31 = auVar18._0_4_ / fVar31;
    fVar15 = auVar19._0_4_ * fVar31;
    local_68 = ZEXT416((uint)(fVar34 * fVar31));
    local_58 = ZEXT416((uint)(fVar33 * fVar31));
    i.high = fVar15;
    i.low = fVar15;
    auVar28._0_8_ = Interval<float>::operator+<float>((Interval<float> *)&local_b8,i);
    auVar28._8_56_ = extraout_var;
    uVar11 = vmovlps_avx(auVar28._0_16_);
    local_b8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .x.low = (float)uVar11;
    local_b8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .x.high = (float)((ulong)uVar11 >> 0x20);
    i_00.high = (float)local_68._0_4_;
    i_00.low = (float)local_68._0_4_;
    auVar29._0_8_ =
         Interval<float>::operator+<float>
                   (&local_b8.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y,i_00);
    auVar29._8_56_ = extraout_var_00;
    uVar11 = vmovlps_avx(auVar29._0_16_);
    local_b8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .y.low = (float)uVar11;
    local_b8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .y.high = (float)((ulong)uVar11 >> 0x20);
    i_01.high = (float)local_58._0_4_;
    i_01.low = (float)local_58._0_4_;
    auVar30._0_8_ =
         Interval<float>::operator+<float>
                   (&local_b8.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z,i_01);
    auVar30._8_56_ = extraout_var_01;
    fVar33 = local_78._0_4_;
    local_b8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .z = (Interval<float>)vmovlps_avx(auVar30._0_16_);
    bVar17 = tMax == (Float *)0x0;
    bVar16 = (POPCOUNT((ulong)tMax & 0xff) & 1U) == 0;
    if (!bVar17) {
      *tMax = *tMax - fVar31;
    }
  }
  auVar19 = vinsertps_avx(local_88,local_98,0x10);
  auVar36._4_4_ =
       local_b8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar36._0_4_ =
       local_b8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  auVar36._8_4_ =
       local_b8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar36._12_4_ =
       local_b8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  auVar18 = vinsertps_avx(auVar36,ZEXT416((uint)local_b8.super_Point3<pbrt::Interval<float>_>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y
                                                .high),0x10);
  auVar32._0_4_ =
       local_b8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar18._0_4_;
  auVar32._4_4_ =
       local_b8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar18._4_4_;
  auVar32._8_4_ = auVar18._8_4_ + 0.0;
  auVar32._12_4_ = auVar18._12_4_ + 0.0;
  auVar35._8_4_ = 0x3f000000;
  auVar35._0_8_ = 0x3f0000003f000000;
  auVar35._12_4_ = 0x3f000000;
  auVar18 = vmulps_avx512vl(auVar32,auVar35);
  uVar11 = vmovlps_avx(auVar18);
  (__return_storage_ptr__->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar11;
  (__return_storage_ptr__->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar11 >> 0x20);
  (__return_storage_ptr__->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
       (local_b8.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
       local_b8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
  uVar11 = vmovlps_avx(auVar19);
  (__return_storage_ptr__->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar11;
  (__return_storage_ptr__->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar11 >> 0x20);
  (__return_storage_ptr__->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z = fVar33;
  (__return_storage_ptr__->super_Ray).time = FVar1;
  (__return_storage_ptr__->super_Ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = uVar12;
  __return_storage_ptr__->hasDifferentials = false;
  auVar27 = ZEXT1232(ZEXT812(0));
  __return_storage_ptr__->rxOrigin = (Point3f)auVar27._0_12_;
  __return_storage_ptr__->ryOrigin = (Point3f)auVar27._12_12_;
  (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar27._24_4_
  ;
  (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar27._28_4_
  ;
  *(undefined1 (*) [32])&(__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
       auVar27;
  __return_storage_ptr__->hasDifferentials = r->hasDifferentials;
  fVar31 = (r->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x;
  fVar33 = (r->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y;
  fVar34 = (r->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z;
  FVar1 = (this->m).m[0][0];
  fVar15 = (this->m).m[0][1];
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * fVar15)),ZEXT416((uint)FVar1),
                            ZEXT416((uint)fVar31));
  FVar2 = (this->m).m[0][2];
  auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)FVar2),ZEXT416((uint)fVar34));
  fVar3 = (this->m).m[0][3];
  fVar13 = fVar3 + auVar19._0_4_;
  FVar4 = (this->m).m[1][0];
  fVar5 = (this->m).m[1][1];
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * fVar5)),ZEXT416((uint)FVar4),
                            ZEXT416((uint)fVar31));
  FVar6 = (this->m).m[1][2];
  auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)FVar6),ZEXT416((uint)fVar34));
  fVar7 = (this->m).m[1][3];
  fVar14 = fVar7 + auVar19._0_4_;
  FVar8 = (this->m).m[2][0];
  fVar9 = (this->m).m[2][1];
  auVar19 = vmulss_avx512f(ZEXT416((uint)fVar33),ZEXT416((uint)fVar9));
  auVar19 = vfmadd231ss_avx512f(auVar19,ZEXT416((uint)FVar8),ZEXT416((uint)fVar31));
  FVar10 = (this->m).m[2][2];
  auVar19 = vfmadd231ss_avx512f(auVar19,ZEXT416((uint)FVar10),ZEXT416((uint)fVar34));
  auVar36 = ZEXT416((uint)(this->m).m[2][3]);
  auVar18 = vaddss_avx512f(auVar36,auVar19);
  auVar26 = ZEXT416((uint)(this->m).m[3][1]);
  auVar19 = vmulss_avx512f(ZEXT416((uint)fVar33),auVar26);
  auVar25 = ZEXT416((uint)(this->m).m[3][0]);
  auVar19 = vfmadd231ss_avx512f(auVar19,auVar25,ZEXT416((uint)fVar31));
  auVar35 = ZEXT416((uint)(this->m).m[3][2]);
  vfmadd231ss_fma(auVar19,auVar35,ZEXT416((uint)fVar34));
  auVar19 = vucomiss_avx512f(ZEXT416(0x3f800000));
  bVar17 = (bool)(bVar17 & !bVar16);
  auVar20 = vdivss_avx512f(ZEXT416((uint)fVar13),auVar19);
  auVar21 = vdivss_avx512f(ZEXT416((uint)fVar14),auVar19);
  auVar22 = vdivss_avx512f(auVar18,auVar19);
  auVar23._4_12_ = auVar20._4_12_;
  auVar23._0_4_ = (uint)bVar17 * (int)fVar13 + (uint)!bVar17 * auVar20._0_4_;
  auVar24._4_12_ = auVar21._4_12_;
  auVar24._0_4_ = (uint)bVar17 * (int)fVar14 + (uint)!bVar17 * auVar21._0_4_;
  auVar19 = vinsertps_avx512f(auVar23,auVar24,0x10);
  uVar11 = vmovlps_avx(auVar19);
  (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar11;
  (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar11 >> 0x20);
  (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z =
       (float)((uint)bVar17 * auVar18._0_4_ + (uint)!bVar17 * auVar22._0_4_);
  fVar31 = (r->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x;
  fVar33 = (r->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y;
  fVar34 = (r->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z;
  auVar19 = vmulss_avx512f(ZEXT416((uint)fVar15),ZEXT416((uint)fVar33));
  auVar19 = vfmadd231ss_avx512f(auVar19,ZEXT416((uint)FVar1),ZEXT416((uint)fVar31));
  auVar19 = vfmadd231ss_avx512f(auVar19,ZEXT416((uint)FVar2),ZEXT416((uint)fVar34));
  auVar18 = vaddss_avx512f(ZEXT416((uint)fVar3),auVar19);
  auVar19 = vmulss_avx512f(ZEXT416((uint)fVar5),ZEXT416((uint)fVar33));
  auVar19 = vfmadd231ss_avx512f(auVar19,ZEXT416((uint)FVar4),ZEXT416((uint)fVar31));
  auVar19 = vfmadd231ss_avx512f(auVar19,ZEXT416((uint)FVar6),ZEXT416((uint)fVar34));
  auVar20 = vaddss_avx512f(ZEXT416((uint)fVar7),auVar19);
  auVar19 = vmulss_avx512f(ZEXT416((uint)fVar9),ZEXT416((uint)fVar33));
  auVar19 = vfmadd231ss_avx512f(auVar19,ZEXT416((uint)FVar8),ZEXT416((uint)fVar31));
  auVar19 = vfmadd231ss_avx512f(auVar19,ZEXT416((uint)FVar10),ZEXT416((uint)fVar34));
  auVar21 = vaddss_avx512f(auVar36,auVar19);
  auVar19 = vmulss_avx512f(auVar26,ZEXT416((uint)fVar33));
  auVar19 = vfmadd231ss_avx512f(auVar19,auVar25,ZEXT416((uint)fVar31));
  vfmadd231ss_fma(auVar19,auVar35,ZEXT416((uint)fVar34));
  auVar19 = vucomiss_avx512f(ZEXT416(0x3f800000));
  bVar16 = !bVar17 && bVar17 != false;
  auVar22 = vdivss_avx512f(auVar21,auVar19);
  auVar25._0_4_ =
       (uint)bVar16 * (int)auVar18._0_4_ + (uint)(bVar17 < 2) * (int)(auVar18._0_4_ / auVar19._0_4_)
  ;
  auVar25._4_12_ = auVar18._4_12_;
  auVar26._0_4_ =
       (uint)bVar16 * (int)auVar20._0_4_ + (uint)(bVar17 < 2) * (int)(auVar20._0_4_ / auVar19._0_4_)
  ;
  auVar26._4_12_ = auVar20._4_12_;
  auVar19 = vinsertps_avx(auVar25,auVar26,0x10);
  uVar11 = vmovlps_avx(auVar19);
  (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar11;
  (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar11 >> 0x20);
  (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z =
       (float)((uint)bVar16 * auVar21._0_4_ + (uint)(bVar17 < 2) * auVar22._0_4_);
  fVar31 = (r->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar33 = (r->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar34 = (r->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * fVar15)),ZEXT416((uint)FVar1),
                            ZEXT416((uint)fVar31));
  auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)FVar2),ZEXT416((uint)fVar34));
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * fVar5)),ZEXT416((uint)FVar4),
                            ZEXT416((uint)fVar31));
  auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)FVar6),ZEXT416((uint)fVar34));
  auVar19 = vinsertps_avx(auVar19,auVar18,0x10);
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * fVar9)),ZEXT416((uint)FVar8),
                            ZEXT416((uint)fVar31));
  auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)FVar10),ZEXT416((uint)fVar34));
  uVar11 = vmovlps_avx(auVar19);
  (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar11;
  (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar11 >> 0x20);
  (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z = auVar18._0_4_;
  fVar31 = (r->ryDirection).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar33 = (r->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar34 = (r->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * fVar15)),ZEXT416((uint)fVar31),
                            ZEXT416((uint)FVar1));
  auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar34),ZEXT416((uint)FVar2));
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * fVar5)),ZEXT416((uint)fVar31),
                            ZEXT416((uint)FVar4));
  auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)fVar34),ZEXT416((uint)FVar6));
  auVar19 = vinsertps_avx(auVar19,auVar18,0x10);
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * fVar9)),ZEXT416((uint)FVar8),
                            ZEXT416((uint)fVar31));
  auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)FVar10),ZEXT416((uint)fVar34));
  uVar11 = vmovlps_avx(auVar19);
  (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar11;
  (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar11 >> 0x20);
  (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z = auVar18._0_4_;
  return __return_storage_ptr__;
}

Assistant:

inline RayDifferential Transform::operator()(const RayDifferential &r,
                                             Float *tMax) const {
    Ray tr = (*this)(Ray(r), tMax);
    RayDifferential ret(tr.o, tr.d, tr.time, tr.medium);
    ret.hasDifferentials = r.hasDifferentials;
    ret.rxOrigin = (*this)(r.rxOrigin);
    ret.ryOrigin = (*this)(r.ryOrigin);
    ret.rxDirection = (*this)(r.rxDirection);
    ret.ryDirection = (*this)(r.ryDirection);
    return ret;
}